

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O2

RK_S32 parse_ptl(HEVCContext *s,PTL *ptl,int max_num_sub_layers)

{
  BitReadCtx_t *pBVar1;
  PTL *pPVar2;
  RK_U8 *pRVar3;
  MPP_RET MVar4;
  uint uVar5;
  RK_U8 *pRVar6;
  RK_U8 *pRVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  RK_S32 _out;
  RK_U8 *local_58;
  BitReadCtx_t *local_50;
  RK_U8 *local_48;
  PTL *local_40;
  HEVCContext *local_38;
  
  pBVar1 = &s->HEVClc->gb;
  decode_profile_tier_level(s,&ptl->general_ptl);
  MVar4 = mpp_read_bits(pBVar1,8,&_out);
  pBVar1->ret = MVar4;
  if (MVar4 == MPP_OK) {
    (ptl->general_ptl).level_idc = (byte)_out;
    pRVar6 = ptl->sub_layer_profile_present_flag;
    uVar8 = 0;
    local_58 = (RK_U8 *)(ulong)(uint)max_num_sub_layers;
    local_50 = pBVar1;
    local_48 = pRVar6;
    local_40 = ptl;
    local_38 = s;
    uVar9 = (ulong)(max_num_sub_layers - 1U);
    if ((int)(max_num_sub_layers - 1U) < 1) {
      uVar9 = uVar8;
    }
    for (; pPVar2 = local_40, pRVar7 = local_48, pBVar1 = local_50, uVar9 != uVar8;
        uVar8 = uVar8 + 1) {
      MVar4 = mpp_read_bits(local_50,1,&_out);
      pRVar7 = local_48;
      pBVar1->ret = MVar4;
      if (MVar4 != MPP_OK) {
        return MVar4;
      }
      local_48[uVar8] = (byte)_out;
      MVar4 = mpp_read_bits(pBVar1,1,&_out);
      local_50->ret = MVar4;
      if (MVar4 != MPP_OK) {
        return MVar4;
      }
      pRVar6 = (RK_U8 *)(ulong)(byte)_out;
      pRVar7[uVar8 + 7] = (byte)_out;
    }
    pRVar3 = local_58;
    if ((int)local_58 < 2) {
LAB_0019a825:
      local_58 = pRVar3;
      pBVar1 = local_50;
      while( true ) {
        MVar4 = (MPP_RET)pRVar6;
        bVar10 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar10) break;
        if (*pRVar7 != '\0') {
          uVar5 = decode_profile_tier_level(local_38,pPVar2->sub_layer_ptl);
          pRVar6 = (RK_U8 *)(ulong)uVar5;
        }
        if (pRVar7[7] != '\0') {
          MVar4 = mpp_read_bits(pBVar1,8,&_out);
          pBVar1->ret = MVar4;
          if (MVar4 != MPP_OK) {
            return MVar4;
          }
          pRVar6 = (RK_U8 *)(ulong)(byte)_out;
          pPVar2->sub_layer_ptl[0].level_idc = (byte)_out;
        }
        pRVar7 = pRVar7 + 1;
        pPVar2 = (PTL *)pPVar2->sub_layer_ptl;
      }
    }
    else {
      local_58 = (RK_U8 *)(ulong)((int)local_58 - 2);
      do {
        uVar5 = (int)local_58 + 1;
        pRVar6 = (RK_U8 *)(ulong)uVar5;
        pRVar3 = pRVar6;
        if (7 < (int)uVar5) goto LAB_0019a825;
        local_58 = pRVar6;
        MVar4 = mpp_skip_longbits(pBVar1,2);
        pBVar1->ret = MVar4;
      } while (MVar4 == MPP_OK);
    }
  }
  return MVar4;
}

Assistant:

static RK_S32 parse_ptl(HEVCContext *s, PTL *ptl, int max_num_sub_layers)
{
    RK_S32 i;
    HEVCLocalContext *lc = s->HEVClc;
    BitReadCtx_t *gb = &lc->gb;

    decode_profile_tier_level(s, &ptl->general_ptl);
    READ_BITS(gb, 8, &ptl->general_ptl.level_idc);

    for (i = 0; i < max_num_sub_layers - 1; i++) {
        READ_ONEBIT(gb, &ptl->sub_layer_profile_present_flag[i]);
        READ_ONEBIT(gb, &ptl->sub_layer_level_present_flag[i]);
    }
    if (max_num_sub_layers - 1 > 0)
        for (i = max_num_sub_layers - 1; i < 8; i++)
            SKIP_BITS(gb, 2); // reserved_zero_2bits[i]
    for (i = 0; i < max_num_sub_layers - 1; i++) {
        if (ptl->sub_layer_profile_present_flag[i])
            decode_profile_tier_level(s, &ptl->sub_layer_ptl[i]);
        if (ptl->sub_layer_level_present_flag[i])
            READ_BITS(gb, 8, &ptl->sub_layer_ptl[i].level_idc);
    }

    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}